

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-impl.h
# Opt level: O0

uint32_t fp32_to_bits(float f)

{
  anon_union_4_2_5fd15f10 fp32;
  float f_local;
  
  return (uint32_t)f;
}

Assistant:

static inline uint32_t fp32_to_bits(float f) {
        union {
            float as_value;
            uint32_t as_bits;
        } fp32;
        fp32.as_value = f;
        return fp32.as_bits;
    }